

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

shared_ptr<ScriptAstNode> parseScript(ostream *out,string *data)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ScriptAstNode> sVar2;
  undefined1 local_88 [8];
  optional<std::shared_ptr<ScriptAstNode>_> maybeScript;
  shared_ptr<SemanticAnalyzer> analyzer;
  shared_ptr<StringReader> reader;
  shared_ptr<Tokenizer> tokenizer;
  shared_ptr<TokenBuffer> tokenBuffer;
  shared_ptr<Parser> parser;
  
  std::make_shared<StringReader,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<Tokenizer,std::shared_ptr<StringReader>&>
            ((shared_ptr<StringReader> *)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<TokenBuffer,std::shared_ptr<Tokenizer>&>
            ((shared_ptr<Tokenizer> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Parser,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((shared_ptr<TokenBuffer> *)
             &tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (basic_ostream<char,_std::char_traits<char>_> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)local_88,
                      (Parser *)
                      tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  if (maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ != '\0') {
    std::__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2> *)out,
               (__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    std::make_shared<SemanticAnalyzer,std::ostream&,std::shared_ptr<StringReader>&>
              ((basic_ostream<char,_std::char_traits<char>_> *)
               &maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged,
               (shared_ptr<StringReader> *)data);
    bVar1 = SemanticAnalyzer::isValid
                      ((SemanticAnalyzer *)
                       maybeScript.
                       super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload
                       .super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                       super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._16_8_,
                       (shared_ptr<ScriptAstNode> *)out);
    if (bVar1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&analyzer);
      std::_Optional_payload_base<std::shared_ptr<ScriptAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<ScriptAstNode>_> *)local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parser);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tokenBuffer);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tokenizer);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader);
      sVar2.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar2.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)out;
      return (shared_ptr<ScriptAstNode>)
             sVar2.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  exit(1);
}

Assistant:

std::shared_ptr<ScriptAstNode> parseScript(std::ostream & out, const std::string & data) {
  auto reader = std::make_shared<StringReader>(data);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, out);

  auto maybeScript = parser->parseScript();

  if (!maybeScript) {
    exit(1);
  }

  auto script = maybeScript.value();

  auto analyzer = std::make_shared<SemanticAnalyzer>(out, reader);

  if (!analyzer->isValid(script)) {
    exit(1);
  }

  return script;
}